

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

int LogLuvDecode32(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  byte bVar1;
  uint8_t *puVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  undefined6 in_register_0000000a;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint8_t *p;
  byte *pbVar10;
  bool bVar11;
  
  if ((int)CONCAT62(in_register_0000000a,s) != 0) {
    __assert_fail("s == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x146,"int LogLuvDecode32(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  puVar2 = tif->tif_data;
  if (puVar2 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x148,"int LogLuvDecode32(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  lVar3 = occ / (long)*(int *)(puVar2 + 0xc);
  p = op;
  if (*(int *)(puVar2 + 4) != 2) {
    if (*(long *)(puVar2 + 0x18) < lVar3) {
      TIFFErrorExtR(tif,"LogLuvDecode32","Translation buffer too short");
      return 0;
    }
    p = *(uint8_t **)(puVar2 + 0x10);
  }
  _TIFFmemset(p,0,lVar3 * 4);
  pbVar10 = tif->tif_rawcp;
  uVar7 = tif->tif_rawcc;
  iVar5 = 0x18;
  do {
    if (iVar5 < 0) {
      (**(code **)(puVar2 + 0x20))(puVar2,op,lVar3);
      tif->tif_rawcp = pbVar10;
      tif->tif_rawcc = uVar7;
      return 1;
    }
    lVar4 = 0;
    while ((lVar4 < lVar3 && (0 < (long)uVar7))) {
      bVar1 = *pbVar10;
      if ((char)bVar1 < '\0') {
        if (uVar7 < 2) break;
        iVar6 = bVar1 - 0x7e;
        bVar1 = pbVar10[1];
        for (; (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11 && (lVar4 < lVar3));
            lVar4 = lVar4 + 1) {
          *(uint *)(p + lVar4 * 4) = *(uint *)(p + lVar4 * 4) | (uint)bVar1 << ((byte)iVar5 & 0x1f);
        }
        pbVar10 = pbVar10 + 2;
        uVar7 = uVar7 - 2;
      }
      else {
        uVar8 = uVar7 - 1;
        uVar7 = uVar8;
        for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          if (((uint)bVar1 == (uint)uVar9) || (lVar3 <= (long)(lVar4 + uVar9))) goto LAB_002633c8;
          *(uint *)(p + uVar9 * 4 + lVar4 * 4) =
               *(uint *)(p + uVar9 * 4 + lVar4 * 4) |
               (uint)pbVar10[uVar9 + 1] << ((byte)iVar5 & 0x1f);
          uVar7 = uVar7 - 1;
        }
        uVar7 = 0;
LAB_002633c8:
        pbVar10 = pbVar10 + uVar9 + 1;
        lVar4 = lVar4 + uVar9;
      }
    }
    iVar5 = iVar5 + -8;
    if (lVar3 != lVar4) {
      TIFFErrorExtR(tif,"LogLuvDecode32","Not enough data at row %u (short %ld pixels)",
                    (ulong)tif->tif_row);
      tif->tif_rawcp = pbVar10;
      tif->tif_rawcc = uVar7;
      return 0;
    }
  } while( true );
}

Assistant:

static int LogLuvDecode32(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "LogLuvDecode32";
    LogLuvState *sp;
    int shft;
    tmsize_t i;
    tmsize_t npixels;
    unsigned char *bp;
    uint32_t *tp;
    uint32_t b;
    tmsize_t cc;
    int rc;

    (void)s;
    assert(s == 0);
    sp = DecoderState(tif);
    assert(sp != NULL);

    npixels = occ / sp->pixel_size;

    if (sp->user_datafmt == SGILOGDATAFMT_RAW)
        tp = (uint32_t *)op;
    else
    {
        if (sp->tbuflen < npixels)
        {
            TIFFErrorExtR(tif, module, "Translation buffer too short");
            return (0);
        }
        tp = (uint32_t *)sp->tbuf;
    }
    _TIFFmemset((void *)tp, 0, npixels * sizeof(tp[0]));

    bp = (unsigned char *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    /* get each byte string */
    for (shft = 24; shft >= 0; shft -= 8)
    {
        for (i = 0; i < npixels && cc > 0;)
        {
            if (*bp >= 128)
            { /* run */
                if (cc < 2)
                    break;
                rc = *bp++ + (2 - 128);
                b = (uint32_t)*bp++ << shft;
                cc -= 2;
                while (rc-- && i < npixels)
                    tp[i++] |= b;
            }
            else
            {               /* non-run */
                rc = *bp++; /* nul is noop */
                while (--cc && rc-- && i < npixels)
                    tp[i++] |= (uint32_t)*bp++ << shft;
            }
        }
        if (i != npixels)
        {
            TIFFErrorExtR(tif, module,
                          "Not enough data at row %" PRIu32
                          " (short %" TIFF_SSIZE_FORMAT " pixels)",
                          tif->tif_row, npixels - i);
            tif->tif_rawcp = (uint8_t *)bp;
            tif->tif_rawcc = cc;
            return (0);
        }
    }
    (*sp->tfunc)(sp, op, npixels);
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    return (1);
}